

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O3

void ralloc_steal(void *new_ctx,void *ptr)

{
  ralloc_header *info;
  long lVar1;
  
  if (ptr == (void *)0x0) {
    return;
  }
  if (*(int *)((long)ptr + -0x30) == 0x5a1106) {
    info = (ralloc_header *)((long)ptr + -0x30);
    if (new_ctx == (void *)0x0) {
      unlink_block(info);
      return;
    }
    if (*(int *)((long)new_ctx + -0x30) == 0x5a1106) {
      unlink_block(info);
      *(long *)((long)ptr + -0x28) = (long)new_ctx + -0x30;
      lVar1 = *(long *)((long)new_ctx + -0x20);
      *(long *)((long)ptr + -0x10) = lVar1;
      *(ralloc_header **)((long)new_ctx + -0x20) = info;
      if (lVar1 == 0) {
        return;
      }
      *(ralloc_header **)(lVar1 + 0x18) = info;
      return;
    }
  }
  __assert_fail("info->canary == CANARY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x5f,"ralloc_header *get_header(const void *)");
}

Assistant:

void
ralloc_steal(const void *new_ctx, void *ptr)
{
   ralloc_header *info, *parent;

   if (unlikely(ptr == NULL))
      return;

   info = get_header(ptr);
   parent = new_ctx ? get_header(new_ctx) : NULL;

   unlink_block(info);

   add_child(parent, info);
}